

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall psy::C::SyntaxDumper::visitTypeName(SyntaxDumper *this,TypeNameSyntax *node)

{
  SpecifierListSyntax *pSVar1;
  _func_int *p_Var2;
  SpecifierListSyntax **ppSVar3;
  
  ppSVar3 = &node->specs_;
  while( true ) {
    pSVar1 = *ppSVar3;
    p_Var2 = (this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e];
    if (pSVar1 == (SpecifierListSyntax *)0x0) break;
    (*p_Var2)(this,(pSVar1->
                   super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                   ).
                   super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                   .value);
    ppSVar3 = &(pSVar1->
               super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               ).
               super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               .next;
  }
  (*p_Var2)(this,node->decltor_);
  return Skip;
}

Assistant:

virtual Action visitTypeName(const TypeNameSyntax* node) override
    {
        for (auto it = node->specifiers(); it; it = it->next)
            nonterminal(it->value);
        nonterminal(node->declarator());
        return Action::Skip;
    }